

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiSolvers.cc
# Opt level: O2

bool __thiscall Glucose::MultiSolvers::eliminate(MultiSolvers *this)

{
  ParallelSolver *this_00;
  bool bVar1;
  
  this_00 = *(this->solvers).data;
  bVar1 = this->use_simplification;
  (this_00->super_SimpSolver).use_simplification = bVar1;
  if (bVar1 == true) {
    bVar1 = SimpSolver::eliminate(&this_00->super_SimpSolver,true);
    return bVar1;
  }
  return true;
}

Assistant:

bool MultiSolvers::eliminate() {

    // TODO allow variable elimination when all threads are built!
    assert(allClonesAreBuilt == false);

    SimpSolver *s = (SimpSolver *) getPrimarySolver();
    s->use_simplification = use_simplification;
    if(!use_simplification) return true;

    return s->eliminate(true);
}